

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancyscene.cpp
# Opt level: O0

void __thiscall graphics101::FancyScene::setPerspectiveMatrix(FancyScene *this)

{
  bool bVar1;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *paVar2;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *paVar3;
  pointer pDVar4;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  mat4 projection;
  int h;
  int w;
  ivec2 width_and_height;
  FancyScene *this_local;
  
  width_and_height = (ivec2)this;
  _h = anon_unknown_31::window_dimensions();
  paVar2 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
           glm::vec<2,_int,_(glm::qualifier)0>::operator[]((vec<2,_int,_(glm::qualifier)0> *)&h,0);
  projection.value[3].field_3 = *paVar2;
  paVar3 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
           glm::vec<2,_int,_(glm::qualifier)0>::operator[]((vec<2,_int,_(glm::qualifier)0> *)&h,1);
  projection.value[3].field_2 = *paVar3;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_drawable);
  if (!bVar1) {
    __assert_fail("m_drawable",
                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/fancyscene.cpp"
                  ,0x180,"void graphics101::FancyScene::setPerspectiveMatrix()");
  }
  Camera::perspective_matrix_for_unit_cube
            ((mat4 *)local_60,(int)projection.value[3].field_3,(int)projection.value[3].field_2,3.0)
  ;
  pDVar4 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(&this->m_drawable);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"uProjectionMatrix",&local_81);
  UniformSet::storeUniform(&pDVar4->uniforms,(string *)local_80,(mat4 *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  KinematicsVisualizer::setProjectionMatrix(&this->m_skelview,(mat4 *)local_60);
  return;
}

Assistant:

void FancyScene::setPerspectiveMatrix() {
    const auto width_and_height = window_dimensions();
    const int w = width_and_height[0];
    const int h = width_and_height[1];
    
    // We want to set uniforms. We need a drawable.
    assert( m_drawable );
    
    // The perspective matrix projects camera coordinates to canonical device coordinates.
    const mat4 projection = Camera::perspective_matrix_for_unit_cube( w, h, 3 );
    m_drawable->uniforms.storeUniform( "uProjectionMatrix", projection );
    
    // Also update the skeleton visualizer.
    m_skelview.setProjectionMatrix( projection );
}